

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::drawForeground(QGraphicsScene *this,QPainter *painter,QRectF *rect)

{
  long lVar1;
  long in_FS_OFFSET;
  QGraphicsScene aQStack_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(*(long *)(lVar1 + 0x178) + 4) != 0) {
    if ((*(byte *)(lVar1 + 0xb9) & 0x40) != 0) {
      QPainter::save();
    }
    QPainter::setBrushOrigin(painter,0,0);
    foregroundBrush(aQStack_38);
    QPainter::fillRect((QRectF *)painter,(QBrush *)rect);
    QBrush::~QBrush((QBrush *)aQStack_38);
    if ((*(byte *)(lVar1 + 0xb9) & 0x40) != 0) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::drawForeground(QPainter *painter, const QRectF &rect)
{
    Q_D(QGraphicsScene);

    if (d->foregroundBrush.style() != Qt::NoBrush) {
        if (d->painterStateProtection)
            painter->save();
        painter->setBrushOrigin(0, 0);
        painter->fillRect(rect, foregroundBrush());
        if (d->painterStateProtection)
            painter->restore();
    }
}